

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection.cc
# Opt level: O2

int __thiscall raptor::Connection::ParsingProtocol(Connection *this)

{
  IProtocol *pIVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  size_t sVar5;
  undefined4 extraout_var;
  uint8_t *puVar6;
  size_t sVar7;
  bool bVar8;
  int iVar9;
  ulong len;
  SliceBuffer *this_00;
  Slice package;
  Slice local_50;
  
  this_00 = &this->_rcv_buffer;
  sVar5 = SliceBuffer::GetBufferLength(this_00);
  iVar3 = (*this->_proto->_vptr_IProtocol[2])();
  iVar9 = 0;
  while( true ) {
    if (sVar5 == 0) {
      return iVar9;
    }
    Slice::Slice(&package);
    bVar2 = ReadSliceFromRecvBuffer(this,CONCAT44(extraout_var,iVar3),&package);
    pIVar1 = this->_proto;
    puVar6 = Slice::begin(&package);
    sVar7 = Slice::size(&package);
    uVar4 = (*pIVar1->_vptr_IProtocol[3])(pIVar1,puVar6,sVar7);
    if ((int)uVar4 < 0) break;
    len = (ulong)uVar4;
    bVar8 = sVar5 < len;
    if (uVar4 == 0) {
      bVar8 = bVar2;
    }
    if (bVar8 != false) {
      Slice::~Slice(&package);
      return iVar9;
    }
    sVar5 = Slice::size(&package);
    if (sVar5 < len) {
      SliceBuffer::GetHeader(&local_50,this_00,len);
      Slice::operator=(&package,&local_50);
      Slice::~Slice(&local_50);
    }
    else {
      sVar5 = Slice::size(&package);
      Slice::CutTail(&package,sVar5 - len);
    }
    (*this->_service->_vptr_INotificationTransfer[3])(this->_service,this->_cid,&package);
    SliceBuffer::MoveHeader(this_00,len);
    sVar5 = SliceBuffer::GetBufferLength(this_00);
    iVar9 = iVar9 + 1;
    Slice::~Slice(&package);
  }
  LogFormatPrint("/workspace/llm4binary/github/license_all_cmakelists_1510/shadow-yuan[P]raptor/core/linux/connection.cc"
                 ,0xed,kLogLevelError,"tcp client: internal protocol error(pack_len = %d)",
                 (ulong)uVar4);
  Slice::~Slice(&package);
  return -1;
}

Assistant:

int Connection::ParsingProtocol() {
    size_t cache_size = _rcv_buffer.GetBufferLength();
    size_t header_size = _proto->GetMaxHeaderSize();
    int package_counter = 0;

    while (cache_size > 0) {
        size_t read_size = header_size;
        int pack_len = 0;
        Slice package;
        do {
            bool reach_tail = ReadSliceFromRecvBuffer(read_size, package);
            pack_len = _proto->CheckPackageLength(package.begin(), package.size());
            if (pack_len < 0) {
                log_error("tcp client: internal protocol error(pack_len = %d)", pack_len);
                return -1;
            }

            // equal 0 means we need more data
            if (pack_len == 0) {
                if (reach_tail) {
                    goto done;
                }
                read_size *= 2;
                continue;
            }

            // We got the length of a whole packet
            if (cache_size >= (size_t)pack_len) {
                break;
            }
            goto done;
        } while (false);

        if (package.size() < static_cast<size_t>(pack_len)) {
            package = _rcv_buffer.GetHeader(pack_len);
        } else {
            size_t n = package.size() - pack_len;
            package.CutTail(n);
        }
        _service->OnDataReceived(_cid, &package);
        _rcv_buffer.MoveHeader(pack_len);

        cache_size = _rcv_buffer.GetBufferLength();
        package_counter++;
    }
done:
    return package_counter;
}